

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O1

void __thiscall ast::Dir_section::Dir_section(Dir_section *this,string *name,Location left)

{
  pointer pcVar1;
  long lVar2;
  string local_50;
  
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013bf38;
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  *(undefined4 *)&(this->super_Directive).super_Statement.location.unit = left.unit._0_4_;
  *(undefined4 *)((long)&(this->super_Directive).super_Statement.location.unit + 4) =
       left.unit._4_4_;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement.section_index = 0;
  (this->super_Directive).super_Statement.section_offset = 0;
  (this->super_Directive).super_Statement.size_in_memory = 0;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_section_0013c7f0
  ;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  Sections::set_section(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  lVar2 = Sections::current_section;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar2 + 0x30);
  (this->super_Directive).super_Statement.size_in_memory = 0;
  return;
}

Assistant:

Dir_section::Dir_section(string name, Location left) :
	Directive {left}, name {name}
{
	Sections::set_section(name);
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	size_in_memory = 0;
}